

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

int WriteOptionString(TidyOptionImpl *option,ctmbstr sval,StreamOut *out)

{
  char *local_28;
  ctmbstr cp;
  StreamOut *out_local;
  ctmbstr sval_local;
  TidyOptionImpl *option_local;
  
  local_28 = option->name;
  while (*local_28 != '\0') {
    prvTidyWriteChar((int)*local_28,out);
    local_28 = local_28 + 1;
  }
  prvTidyWriteChar(0x3a,out);
  prvTidyWriteChar(0x20,out);
  local_28 = sval;
  while (*local_28 != '\0') {
    prvTidyWriteChar((int)*local_28,out);
    local_28 = local_28 + 1;
  }
  prvTidyWriteChar(10,out);
  return 0;
}

Assistant:

static int  WriteOptionString( const TidyOptionImpl* option,
                               ctmbstr sval, StreamOut* out )
{
  ctmbstr cp = option->name;
  while ( *cp )
      TY_(WriteChar)( *cp++, out );
  TY_(WriteChar)( ':', out );
  TY_(WriteChar)( ' ', out );
  cp = sval;
  while ( *cp )
      TY_(WriteChar)( *cp++, out );
  TY_(WriteChar)( '\n', out );
  return 0;
}